

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O1

string * SimpleWeb::Crypto::Base64::encode(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  BUF_MEM *parg;
  BIO_METHOD *pBVar2;
  BIO *b;
  BIO *append;
  long lVar3;
  ulong uVar4;
  double dVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  parg = BUF_MEM_new();
  pBVar2 = BIO_f_base64();
  b = BIO_new(pBVar2);
  BIO_set_flags(b,0x100);
  pBVar2 = BIO_s_mem();
  append = BIO_new(pBVar2);
  BIO_push(b,append);
  BIO_ctrl(b,0x72,1,parg);
  dVar5 = ceil((((double)CONCAT44(0x45300000,(int)(input->_M_string_length >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)input->_M_string_length) - 4503599627370496.0)) /
               3.0);
  dVar5 = round(dVar5 * 4.0);
  uVar4 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar4);
  parg->length = 0;
  parg->max = uVar4 + 1;
  parg->data = (__return_storage_ptr__->_M_dataplus)._M_p;
  iVar1 = BIO_write(b,(input->_M_dataplus)._M_p,(int)input->_M_string_length);
  if (0 < iVar1) {
    lVar3 = BIO_ctrl(b,0xb,0,(void *)0x0);
    if (0 < (int)lVar3) goto LAB_001a84cf;
  }
  __return_storage_ptr__->_M_string_length = 0;
  *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
LAB_001a84cf:
  parg->length = 0;
  parg->data = (char *)0x0;
  parg->max = 0;
  BIO_free_all(b);
  return __return_storage_ptr__;
}

Assistant:

static std::string encode(const std::string &input) noexcept {
        std::string base64;

        BIO *bio, *b64;
        BUF_MEM *bptr = BUF_MEM_new();

        b64 = BIO_new(BIO_f_base64());
        BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);
        bio = BIO_new(BIO_s_mem());
        BIO_push(b64, bio);
        BIO_set_mem_buf(b64, bptr, BIO_CLOSE);

        // Write directly to base64-buffer to avoid copy
        auto base64_length = static_cast<std::size_t>(round(4 * ceil(static_cast<double>(input.size()) / 3.0)));
        base64.resize(base64_length);
        bptr->length = 0;
        bptr->max = base64_length + 1;
        bptr->data = &base64[0];

        if(BIO_write(b64, &input[0], static_cast<int>(input.size())) <= 0 || BIO_flush(b64) <= 0)
          base64.clear();

        // To keep &base64[0] through BIO_free_all(b64)
        bptr->length = 0;
        bptr->max = 0;
        bptr->data = nullptr;

        BIO_free_all(b64);

        return base64;
      }